

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test9.cpp
# Opt level: O0

int main(void)

{
  InetAddress *this;
  size_t *this_00;
  Writer *pWVar1;
  MessageCallback local_220;
  ConnectionCallback local_200;
  undefined1 local_1e0 [8];
  TcpServer server;
  EventLoop loop;
  InetAddress listenAddr;
  Writer local_80;
  
  el::base::Writer::Writer
            (&local_80,Info,
             "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/tests/test9.cpp"
             ,0x1e,"int main()",NormalLog,0);
  pWVar1 = el::base::Writer::construct(&local_80,1,el::base::consts::kDefaultLoggerId);
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [13])"main: pid = ");
  listenAddr._addr.sin_zero._4_4_ = getpid();
  pWVar1 = el::base::Writer::operator<<(pWVar1,(int *)(listenAddr._addr.sin_zero + 4));
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [9])", tid = ");
  listenAddr._addr.sin_zero._0_4_ = mario::CurrentThread::tid();
  el::base::Writer::operator<<(pWVar1,(int *)listenAddr._addr.sin_zero);
  el::base::Writer::~Writer(&local_80);
  this = (InetAddress *)
         ((long)&loop._activeChannels.
                 super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 4);
  mario::InetAddress::InetAddress(this,0x26fd);
  this_00 = &server._connections._M_t._M_impl.super__Rb_tree_header._M_node_count;
  mario::EventLoop::EventLoop((EventLoop *)this_00);
  mario::TcpServer::TcpServer((TcpServer *)local_1e0,(EventLoop *)this_00,this);
  std::function<void(std::shared_ptr<mario::TcpConnection>const&)>::
  function<void(&)(std::shared_ptr<mario::TcpConnection>const&),void>
            ((function<void(std::shared_ptr<mario::TcpConnection>const&)> *)&local_200,onConnection)
  ;
  mario::TcpServer::setConnectionCallback((TcpServer *)local_1e0,&local_200);
  std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>::~function(&local_200);
  std::function<void(std::shared_ptr<mario::TcpConnection>const&,mario::Buffer*,mario::Timestamp)>::
  function<void(&)(std::shared_ptr<mario::TcpConnection>const&,mario::Buffer*,mario::Timestamp),void>
            ((function<void(std::shared_ptr<mario::TcpConnection>const&,mario::Buffer*,mario::Timestamp)>
              *)&local_220,onMessage);
  mario::TcpServer::setMessageCallback((TcpServer *)local_1e0,&local_220);
  std::
  function<void_(const_std::shared_ptr<mario::TcpConnection>_&,_mario::Buffer_*,_mario::Timestamp)>
  ::~function(&local_220);
  mario::TcpServer::setThreadNum((TcpServer *)local_1e0,3);
  mario::TcpServer::start((TcpServer *)local_1e0);
  mario::EventLoop::loop
            ((EventLoop *)&server._connections._M_t._M_impl.super__Rb_tree_header._M_node_count);
  mario::TcpServer::~TcpServer((TcpServer *)local_1e0);
  mario::EventLoop::~EventLoop
            ((EventLoop *)&server._connections._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return 0;
}

Assistant:

INITIALIZE_EASYLOGGINGPP

int main() {
    LOG(INFO) << "main: pid = "<< getpid() << ", tid = " << mario::CurrentThread::tid();

    mario::InetAddress listenAddr(9981);
    mario::EventLoop loop;

    mario::TcpServer server(&loop, listenAddr);
    server.setConnectionCallback(onConnection);
    server.setMessageCallback(onMessage);
    server.setThreadNum(3);
    server.start();

    loop.loop();
}